

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

Gia_Man_t * Gia_ManDupHashMapping(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *p_01;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  int Fill;
  int iVar7;
  long lVar8;
  
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                  ,0x9f9,"Gia_Man_t *Gia_ManDupHashMapping(Gia_Man_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  for (iVar7 = 0; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManCi(p,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar4->Value = uVar1;
  }
  for (iVar7 = 0; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManObj(p,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      iVar2 = Gia_ObjFanin0Copy(pGVar4);
      uVar1 = (uint)((ulong)*(undefined8 *)pGVar4 >> 0x20);
      iLit1 = Abc_LitNotCond(pGVar4[-(ulong)(uVar1 & 0x1fffffff)].Value,uVar1 >> 0x1d & 1);
      uVar1 = Gia_ManHashAnd(p_00,iVar2,iLit1);
      pGVar4->Value = uVar1;
    }
  }
  for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManCo(p,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar4);
    Gia_ManAppendCo(p_00,iVar2);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  p_01 = Vec_IntAlloc(p->vMapping->nSize);
  Vec_IntFill(p_01,p->nObjs,Fill);
  for (iVar7 = 1; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
    iVar2 = Gia_ObjIsLut(p,iVar7);
    if (iVar2 != 0) {
      pGVar4 = Gia_ManObj(p,iVar7);
      iVar2 = Abc_Lit2Var(pGVar4->Value);
      Vec_IntWriteEntry(p_01,iVar2,p_01->nSize);
      iVar2 = Gia_ObjLutSize(p,iVar7);
      Vec_IntPush(p_01,iVar2);
      lVar8 = 0;
      while( true ) {
        iVar2 = Gia_ObjLutSize(p,iVar7);
        if (iVar2 <= lVar8) break;
        piVar5 = Gia_ObjLutFanins(p,iVar7);
        pGVar6 = Gia_ManObj(p,piVar5[lVar8]);
        iVar2 = Abc_Lit2Var(pGVar6->Value);
        Vec_IntPush(p_01,iVar2);
        lVar8 = lVar8 + 1;
      }
      iVar2 = Abc_Lit2Var(pGVar4->Value);
      Vec_IntPush(p_01,iVar2);
    }
  }
  p_00->vMapping = p_01;
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupHashMapping( Gia_Man_t * p )
{
    Gia_Man_t * pNew; 
    Vec_Int_t * vMapping; 
    Gia_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Gia_ManHasMapping(p) );
    // copy the old manager with hashing
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // recreate mapping
    vMapping = Vec_IntAlloc( Vec_IntSize(p->vMapping) );
    Vec_IntFill( vMapping, Gia_ManObjNum(p), 0 );
    Gia_ManForEachLut( p, i )
    {
        pObj = Gia_ManObj( p, i );
        Vec_IntWriteEntry( vMapping, Abc_Lit2Var(pObj->Value), Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, Gia_ObjLutSize(p, i) );
        Gia_LutForEachFaninObj( p, i, pFanin, k )
            Vec_IntPush( vMapping, Abc_Lit2Var(pFanin->Value)  );
        Vec_IntPush( vMapping, Abc_Lit2Var(pObj->Value) );
    }
    pNew->vMapping = vMapping;
    return pNew;
}